

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_buildCTable_raw(FSE_CTable *ct,uint nbBits)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  short sVar11;
  short sVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar19 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar17 [32];
  
  uVar13 = 1 << ((byte)nbBits & 0x1f);
  if (nbBits == 0) {
    return 0xffffffffffffffff;
  }
  *(short *)ct = (short)nbBits;
  sVar11 = (short)uVar13;
  *(short *)((long)ct + 2) = sVar11 + -1;
  uVar14 = (ulong)uVar13;
  lVar1 = uVar14 - 1;
  auVar16._8_8_ = lVar1;
  auVar16._0_8_ = lVar1;
  auVar17._16_8_ = lVar1;
  auVar17._0_16_ = auVar16;
  auVar17._24_8_ = lVar1;
  auVar5 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
  auVar6 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
  auVar7 = vpmovsxbq_avx2(ZEXT416(0x7060504));
  auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  uVar15 = 0;
  auVar18._8_8_ = 0x8000000000000000;
  auVar18._0_8_ = 0x8000000000000000;
  auVar2 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
  auVar19._8_8_ = 0x8000000000000000;
  auVar19._0_8_ = 0x8000000000000000;
  auVar19._16_8_ = 0x8000000000000000;
  auVar19._24_8_ = 0x8000000000000000;
  auVar10 = auVar19 ^ auVar17;
  auVar3 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
  auVar20._8_8_ = 0x10;
  auVar20._0_8_ = 0x10;
  auVar20._16_8_ = 0x10;
  auVar20._24_8_ = 0x10;
  do {
    auVar21 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    sVar12 = (short)uVar15;
    if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 4) = sVar11 + sVar12;
    }
    auVar21 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 6) = sVar11 + sVar12 + 1;
    }
    auVar4 = vpcmpgtq_avx2(auVar19 ^ auVar8,auVar10);
    auVar9 = vpshuflw_avx2(auVar4,0xe8);
    auVar21._0_4_ = auVar9._16_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 8) = sVar11 + sVar12 + 2;
    }
    auVar21 = vpackssdw_avx(auVar4._16_16_,auVar4._16_16_);
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 10) = sVar11 + sVar12 + 3;
    }
    auVar21 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    auVar4 = vpermq_avx2(ZEXT1632(auVar21 ^ auVar2),0x55);
    auVar4 = vpackssdw_avx2(auVar4,auVar17);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0xc) = sVar11 + sVar12 + 4;
    }
    auVar21 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpshufhw_avx(auVar21,0x84);
    auVar4 = vpermq_avx2(ZEXT1632(auVar21 ^ auVar2),0x55);
    auVar4 = vpackssdw_avx2(auVar4,auVar17);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0xe) = sVar11 + sVar12 + 5;
    }
    auVar9 = vpcmpgtq_avx2(auVar19 ^ auVar7,auVar10);
    auVar4 = vpackssdw_avx2(auVar17,auVar9);
    auVar4 = vpackssdw_avx2(auVar4 ^ auVar3,auVar17);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x10) = sVar11 + sVar12 + 6;
    }
    auVar4 = vpackssdw_avx2(auVar17,auVar9);
    auVar4 = vpackssdw_avx2(auVar4 ^ auVar3,auVar17);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x12) = sVar11 + sVar12 + 7;
    }
    auVar21 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x14) = sVar11 + sVar12 + 8;
    }
    auVar21 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x16) = sVar11 + sVar12 + 9;
    }
    auVar4 = vpcmpgtq_avx2(auVar19 ^ auVar6,auVar10);
    auVar9 = vpshuflw_avx2(auVar4,0xe8);
    auVar22._0_4_ = auVar9._16_4_;
    auVar22._4_4_ = auVar22._0_4_;
    auVar22._8_4_ = auVar22._0_4_;
    auVar22._12_4_ = auVar22._0_4_;
    auVar21 = vpackssdw_avx(auVar22 ^ auVar2,auVar22 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x18) = sVar11 + sVar12 + 10;
    }
    auVar21 = vpackssdw_avx(auVar4._16_16_,auVar4._16_16_);
    auVar21 = vpackssdw_avx(auVar21 ^ auVar2,auVar21 ^ auVar2);
    auVar21 = vpacksswb_avx(auVar21,auVar21);
    if ((auVar21 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x1a) = sVar11 + sVar12 + 0xb;
    }
    auVar21 = vpcmpgtq_avx(auVar5._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    auVar4 = vpermq_avx2(ZEXT1632(auVar21 ^ auVar2),0x55);
    auVar4 = vpackssdw_avx2(auVar17,auVar4);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x1c) = sVar11 + sVar12 + 0xc;
    }
    auVar21 = vpcmpgtq_avx(auVar5._0_16_ ^ auVar18,auVar16 ^ auVar18);
    auVar21 = vpshufhw_avx(auVar21,0x84);
    auVar4 = vpermq_avx2(ZEXT1632(auVar21 ^ auVar2),0x55);
    auVar4 = vpackssdw_avx2(auVar17,auVar4);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x1e) = sVar11 + sVar12 + 0xd;
    }
    auVar9 = vpcmpgtq_avx2(auVar19 ^ auVar5,auVar10);
    auVar4 = vpackssdw_avx2(auVar17,auVar9);
    auVar4 = vpackssdw_avx2(auVar17,auVar4 ^ auVar3);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x20) = sVar11 + sVar12 + 0xe;
    }
    auVar4 = vpackssdw_avx2(auVar17,auVar9);
    auVar4 = vpackssdw_avx2(auVar17,auVar4 ^ auVar3);
    auVar21 = vpacksswb_avx(auVar4._16_16_,auVar4._16_16_);
    if ((auVar21 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(short *)((long)ct + uVar15 * 2 + 0x22) = sVar11 + sVar12 + 0xf;
    }
    uVar15 = uVar15 + 0x10;
    auVar8 = vpaddq_avx2(auVar20,auVar8);
    auVar7 = vpaddq_avx2(auVar20,auVar7);
    auVar6 = vpaddq_avx2(auVar20,auVar6);
    auVar5 = vpaddq_avx2(auVar20,auVar5);
  } while ((uVar14 + 0xf & 0xfffffffffffffff0) != uVar15);
  uVar15 = 0;
  do {
    ct[(ulong)(uVar13 >> 1) + uVar15 * 2 + 2] = nbBits * 0x10000 - uVar13;
    ct[(ulong)(uVar13 >> 1) + uVar15 * 2 + 1] = (int)uVar15 - 1;
    uVar15 = uVar15 + 1;
  } while (uVar14 != uVar15);
  return 0;
}

Assistant:

size_t FSE_buildCTable_raw (FSE_CTable* ct, unsigned nbBits)
{
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSymbolValue = tableMask;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableSize>>1);   /* assumption : tableLog >= 1 */
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);             /* min size */

    /* header */
    tableU16[-2] = (U16) nbBits;
    tableU16[-1] = (U16) maxSymbolValue;

    /* Build table */
    for (s=0; s<tableSize; s++)
        tableU16[s] = (U16)(tableSize + s);

    /* Build Symbol Transformation Table */
    {   const U32 deltaNbBits = (nbBits << 16) - (1 << nbBits);
        for (s=0; s<=maxSymbolValue; s++) {
            symbolTT[s].deltaNbBits = deltaNbBits;
            symbolTT[s].deltaFindState = s-1;
    }   }

    return 0;
}